

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

SourceBuffer * __thiscall
slang::SourceManager::cacheBuffer
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,path *path,string *pathStr,
          SourceLocation includedFrom,SourceLibrary *library,uint64_t sortKey,
          SmallVector<char,_40UL> *buffer)

{
  flat_hash_map<std::string,_std::pair<std::unique_ptr<FileData>,_std::error_code>_> *this_00;
  size_t *psVar1;
  group_type_pointer pgVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var6;
  size_t __n;
  uint uVar7;
  SourceManager *pSVar8;
  string *psVar9;
  value_type_pointer ppVar10;
  SourceLocation includedFrom_00;
  SourceLibrary *library_00;
  SourceBuffer *__return_storage_ptr___00;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  group_type_pointer pgVar15;
  path *__p;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  pair<std::_Rb_tree_iterator<std::filesystem::__cxx11::path>,_bool> pVar40;
  __single_object fd;
  string name;
  unique_lock<std::shared_mutex> lock;
  locator res;
  value_type *elements;
  string *in_stack_fffffffffffffe98;
  try_emplace_args_t local_149;
  FileData *local_148;
  SourceManager *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string *local_118;
  unique_lock<std::shared_mutex> local_110;
  path local_100;
  path local_d8;
  uint64_t local_b0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
  *local_a8;
  ulong local_a0;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  group_type_pointer local_80;
  ulong local_78;
  value_type_pointer local_70;
  SourceLocation local_68;
  SourceLibrary *local_60;
  SourceBuffer *local_58;
  pointer local_50;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  paVar3 = &local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_140 = this;
  local_138._M_dataplus._M_p = (pointer)paVar3;
  local_118 = pathStr;
  if (this->disableProximatePaths == false) {
    local_110._M_device = (mutex_type *)((ulong)local_110._M_device & 0xffffffff00000000);
    local_110._8_8_ = std::_V2::system_category();
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::proximate(&local_100,path,(error_code *)&local_d8);
    std::filesystem::__cxx11::path::~path(&local_d8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_138,&local_100._M_pathname);
    std::filesystem::__cxx11::path::~path(&local_100);
    if ((int)local_110._M_device != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_138,0,local_138._M_string_length,(char *)0x0,0);
    }
  }
  if (local_138._M_string_length != 0) goto LAB_001dc94a;
  sVar5 = (path->_M_pathname)._M_string_length;
  if (sVar5 == 0) {
LAB_001dc91e:
    std::filesystem::__cxx11::path::path(&local_d8);
  }
  else {
    _Var6._M_head_impl =
         (path->_M_cmpts)._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    __p = path;
    if ((~(byte)_Var6._M_head_impl & 3) != 0) {
      if ((((ulong)_Var6._M_head_impl & 3) == 0) &&
         ((path->_M_pathname)._M_dataplus._M_p[sVar5 - 1] != '/')) {
        if (((ulong)_Var6._M_head_impl & 3) == 0) {
          lVar12 = std::filesystem::__cxx11::path::_List::end();
        }
        else {
          lVar12 = 0;
        }
        __p = (path *)(lVar12 + -0x30);
        if ((*(byte *)&(path->_M_cmpts)._M_impl._M_t.
                       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                       ._M_head_impl & 3) != 0) {
          __p = path;
        }
        if ((~*(uint *)&(__p->_M_cmpts)._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl & 3) == 0) goto LAB_001dc90f;
      }
      goto LAB_001dc91e;
    }
LAB_001dc90f:
    std::filesystem::__cxx11::path::path(&local_d8,__p);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_138,&local_d8._M_pathname);
  std::filesystem::__cxx11::path::~path(&local_d8);
LAB_001dc94a:
  local_110._M_device = &local_140->mutex;
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::shared_mutex>::lock(&local_110);
  local_110._M_owns = true;
  std::filesystem::__cxx11::path::parent_path();
  pVar40 = std::
           _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
           ::_M_insert_unique<std::filesystem::__cxx11::path>
                     (&(local_140->directories)._M_t,&local_d8);
  local_68 = includedFrom;
  local_60 = library;
  local_58 = __return_storage_ptr__;
  std::filesystem::__cxx11::path::~path(&local_d8);
  local_148 = (FileData *)operator_new(0xa8);
  paVar4 = &local_100._M_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == paVar3) {
    local_100._M_pathname.field_2._8_8_ = local_138.field_2._8_8_;
    local_100._M_pathname._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_100._M_pathname._M_dataplus._M_p = local_138._M_dataplus._M_p;
  }
  local_100._M_pathname.field_2._M_allocated_capacity._1_7_ =
       local_138.field_2._M_allocated_capacity._1_7_;
  local_100._M_pathname.field_2._M_local_buf[0] = local_138.field_2._M_local_buf[0];
  local_100._M_pathname._M_string_length = local_138._M_string_length;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_138._M_dataplus._M_p = (pointer)paVar3;
  std::filesystem::__cxx11::path::path(&local_d8,path);
  FileData::FileData(local_148,(path *)(pVar40.first._M_node._M_node + 1),&local_100._M_pathname,
                     buffer,&local_d8);
  std::filesystem::__cxx11::path::~path(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_pathname._M_dataplus._M_p != paVar4) {
    operator_delete(local_100._M_pathname._M_dataplus._M_p,
                    local_100._M_pathname.field_2._M_allocated_capacity + 1);
  }
  pSVar8 = local_140;
  this_00 = &local_140->lookupCache;
  local_100._M_pathname.field_2._M_allocated_capacity = std::_V2::system_category();
  psVar9 = local_118;
  local_100._M_pathname._M_dataplus._M_p = (pointer)local_148;
  local_148 = (FileData *)0x0;
  local_100._M_pathname._M_string_length =
       local_100._M_pathname._M_string_length & 0xffffffff00000000;
  local_a8 = (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
              *)this_00;
  local_b0 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)this_00,local_118);
  uVar16 = local_b0 >>
           ((byte)(pSVar8->lookupCache).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar15 = (pSVar8->lookupCache).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
            .arrays.groups_;
  lVar12 = (local_b0 & 0xff) * 4;
  uVar24 = (&UNK_0047c76c)[lVar12];
  uVar25 = (&UNK_0047c76d)[lVar12];
  uVar26 = (&UNK_0047c76e)[lVar12];
  uVar27 = (&UNK_0047c76f)[lVar12];
  local_70 = (pSVar8->lookupCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
             .arrays.elements_;
  local_50 = (psVar9->_M_dataplus)._M_p;
  __n = psVar9->_M_string_length;
  uVar13 = (ulong)((uint)local_b0 & 7);
  sVar18 = (pSVar8->lookupCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
           .arrays.groups_size_mask;
  local_78 = uVar16;
  uVar20 = 0;
  uVar28 = uVar24;
  uVar29 = uVar25;
  uVar30 = uVar26;
  uVar31 = uVar27;
  uVar32 = uVar24;
  uVar33 = uVar25;
  uVar34 = uVar26;
  uVar35 = uVar27;
  uVar36 = uVar24;
  uVar37 = uVar25;
  uVar38 = uVar26;
  uVar39 = uVar27;
  do {
    ppVar10 = local_70;
    pgVar2 = pgVar15 + uVar16;
    auVar23[0] = -(pgVar2->m[0].n == uVar24);
    auVar23[1] = -(pgVar2->m[1].n == uVar25);
    auVar23[2] = -(pgVar2->m[2].n == uVar26);
    auVar23[3] = -(pgVar2->m[3].n == uVar27);
    auVar23[4] = -(pgVar2->m[4].n == uVar28);
    auVar23[5] = -(pgVar2->m[5].n == uVar29);
    auVar23[6] = -(pgVar2->m[6].n == uVar30);
    auVar23[7] = -(pgVar2->m[7].n == uVar31);
    auVar23[8] = -(pgVar2->m[8].n == uVar32);
    auVar23[9] = -(pgVar2->m[9].n == uVar33);
    auVar23[10] = -(pgVar2->m[10].n == uVar34);
    auVar23[0xb] = -(pgVar2->m[0xb].n == uVar35);
    auVar23[0xc] = -(pgVar2->m[0xc].n == uVar36);
    auVar23[0xd] = -(pgVar2->m[0xd].n == uVar37);
    auVar23[0xe] = -(pgVar2->m[0xe].n == uVar38);
    auVar23[0xf] = -(pgVar2->m[0xf].n == uVar39);
    uVar14 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
    uVar17 = uVar16;
    uVar19 = uVar20;
    if (uVar14 != 0) {
      local_a0 = uVar20;
      local_90 = sVar18;
      local_88 = uVar13;
      local_80 = pgVar15;
      local_98 = uVar16;
      local_48 = uVar24;
      uStack_47 = uVar25;
      uStack_46 = uVar26;
      uStack_45 = uVar27;
      uStack_44 = uVar28;
      uStack_43 = uVar29;
      uStack_42 = uVar30;
      uStack_41 = uVar31;
      uStack_40 = uVar32;
      uStack_3f = uVar33;
      uStack_3e = uVar34;
      uStack_3d = uVar35;
      uStack_3c = uVar36;
      uStack_3b = uVar37;
      uStack_3a = uVar38;
      uStack_39 = uVar39;
      do {
        uVar7 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        bVar22 = __n == ppVar10[uVar16 * 0xf + (ulong)uVar7].first._M_string_length;
        uVar21 = ppVar10 + uVar16 * 0xf + (ulong)uVar7;
        if (bVar22 && __n != 0) {
          iVar11 = bcmp(local_50,(((value_type_pointer)uVar21)->first)._M_dataplus._M_p,__n);
          bVar22 = iVar11 == 0;
          uVar24 = local_48;
          uVar25 = uStack_47;
          uVar26 = uStack_46;
          uVar27 = uStack_45;
          uVar28 = uStack_44;
          uVar29 = uStack_43;
          uVar30 = uStack_42;
          uVar31 = uStack_41;
          uVar32 = uStack_40;
          uVar33 = uStack_3f;
          uVar34 = uStack_3e;
          uVar35 = uStack_3d;
          uVar36 = uStack_3c;
          uVar37 = uStack_3b;
          uVar38 = uStack_3a;
          uVar39 = uStack_39;
        }
        if (bVar22) goto LAB_001dcc5a;
        uVar14 = uVar14 - 1 & uVar14;
        pgVar15 = local_80;
        uVar13 = local_88;
        uVar17 = local_98;
        sVar18 = local_90;
        uVar19 = local_a0;
      } while (uVar14 != 0);
    }
    if ((pgVar15[uVar16].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar13]) == 0) break;
    uVar20 = uVar19 + 1;
    uVar16 = uVar17 + uVar19 + 1 & sVar18;
  } while (uVar20 <= sVar18);
  uVar21 = (value_type_pointer)0x0;
LAB_001dcc5a:
  __return_storage_ptr___00 = local_58;
  library_00 = local_60;
  includedFrom_00 = local_68;
  if ((value_type_pointer)uVar21 == (value_type_pointer)0x0) {
    if ((local_140->lookupCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
        .size_ctrl.size <
        (local_140->lookupCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
        .size_ctrl.ml) {
      in_stack_fffffffffffffe98 = local_118;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>
                ((locator *)&local_d8,local_a8,(arrays_type *)local_a8,local_78,local_b0,&local_149,
                 local_118,
                 (pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
                  *)&local_100);
      psVar1 = &(local_140->lookupCache).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      uVar21 = local_d8._M_pathname.field_2._M_allocated_capacity;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>
                ((locator *)&local_d8,local_a8,local_b0,&local_149,local_118,
                 (pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
                  *)&local_100);
      uVar21 = local_d8._M_pathname.field_2._M_allocated_capacity;
    }
  }
  if ((FileData *)local_100._M_pathname._M_dataplus._M_p != (FileData *)0x0) {
    std::default_delete<slang::SourceManager::FileData>::operator()
              ((default_delete<slang::SourceManager::FileData> *)&local_100,
               (FileData *)local_100._M_pathname._M_dataplus._M_p);
  }
  createBufferEntry(__return_storage_ptr___00,local_140,
                    (((value_type_pointer)uVar21)->second).first._M_t.
                    super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                    .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl,
                    includedFrom_00,library_00,sortKey,
                    (unique_lock<std::shared_mutex> *)in_stack_fffffffffffffe98);
  if (local_148 != (FileData *)0x0) {
    std::default_delete<slang::SourceManager::FileData>::operator()
              ((default_delete<slang::SourceManager::FileData> *)&local_148,local_148);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr___00;
}

Assistant:

SourceBuffer SourceManager::cacheBuffer(fs::path&& path, std::string&& pathStr,
                                        SourceLocation includedFrom, const SourceLibrary* library,
                                        uint64_t sortKey, SmallVector<char>&& buffer) {
    std::string name;
    if (!disableProximatePaths) {
        std::error_code ec;
        name = getU8Str(fs::proximate(path, ec));
        if (ec)
            name = {};
    }

    if (name.empty())
        name = getU8Str(path.filename());

    std::unique_lock<std::shared_mutex> lock(mutex);

    auto directory = &*directories.insert(path.parent_path()).first;
    auto fd = std::make_unique<FileData>(directory, std::move(name), std::move(buffer),
                                         std::move(path));

    // Note: it's possible that insertion here fails due to another thread
    // racing against us to open and insert the same file. We do a lookup
    // in the cache before proceeding to read the file but we drop the lock
    // during the read. It's not actually a problem, we'll just use the data
    // we already loaded (just like we had gotten a hit on the cache in the
    // first place).
    auto [it, inserted] = lookupCache.emplace(pathStr, std::pair{std::move(fd), std::error_code{}});

    FileData* fdPtr = it->second.first.get();
    return createBufferEntry(fdPtr, includedFrom, library, sortKey, lock);
}